

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

bool __thiscall QGraphicsItem::isObscured(QGraphicsItem *this,QRectF *rect)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  const_iterator o;
  QGraphicsItem **ppQVar3;
  QRectF *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  QGraphicsItemPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items;
  QRectF testRect;
  QRectF br;
  QTransform *this_00;
  QRectF *local_128;
  SortOrder in_stack_fffffffffffffee8;
  ItemSelectionMode in_stack_fffffffffffffeec;
  QRectF *in_stack_fffffffffffffef0;
  QGraphicsItem *in_stack_fffffffffffffef8;
  QGraphicsItem *item_00;
  bool local_e1;
  const_iterator local_d0 [4];
  QGraphicsItem local_b0;
  undefined1 *local_a0;
  qreal local_98;
  qreal local_90;
  qreal local_88;
  qreal local_80;
  QRectF local_78 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsItem *)0x981595);
  if (pQVar2->scene == (QGraphicsScene *)0x0) {
    local_e1 = false;
  }
  else {
    local_78[0].xp = -NAN;
    local_78[0].yp = -NAN;
    local_78[0].w = -NAN;
    local_78[0].h = -NAN;
    (*in_RDI->_vptr_QGraphicsItem[3])(local_78);
    local_98 = -NAN;
    local_90 = -NAN;
    local_88 = -NAN;
    local_80 = -NAN;
    bVar1 = QRectF::isNull(in_RSI);
    local_128 = in_RSI;
    if (bVar1) {
      local_128 = local_78;
    }
    local_98 = local_128->xp;
    local_90 = local_128->yp;
    local_88 = local_128->w;
    local_80 = local_128->h;
    local_b0._vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_b0.d_ptr.d = (QGraphicsItemPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QTransform *)pQVar2->scene;
    mapToScene(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    QTransform::QTransform(this_00);
    QGraphicsScene::items
              ((QGraphicsScene *)in_stack_fffffffffffffef8,(QPolygonF *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,(QTransform *)in_RDI);
    QPolygonF::~QPolygonF((QPolygonF *)0x981731);
    item_00 = &local_b0;
    local_d0[0].i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_d0[0] = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
    o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
    while (bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(local_d0,o), bVar1) {
      ppQVar3 = QList<QGraphicsItem_*>::const_iterator::operator*(local_d0);
      if (*ppQVar3 == in_RDI) break;
      bVar1 = qt_QGraphicsItem_isObscured
                        (item_00,*ppQVar3,
                         (QRectF *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (bVar1) {
        local_e1 = true;
        goto LAB_0098180c;
      }
      QList<QGraphicsItem_*>::const_iterator::operator++(local_d0);
    }
    local_e1 = false;
LAB_0098180c:
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x981819);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_e1;
}

Assistant:

bool QGraphicsItem::isObscured(const QRectF &rect) const
{
    Q_D(const QGraphicsItem);
    if (!d->scene)
        return false;

    QRectF br = boundingRect();
    QRectF testRect = rect.isNull() ? br : rect;

    const auto items = d->scene->items(mapToScene(br), Qt::IntersectsItemBoundingRect);
    for (QGraphicsItem *item : items) {
        if (item == this)
            break;
        if (qt_QGraphicsItem_isObscured(this, item, testRect))
            return true;
    }
    return false;
}